

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.h
# Opt level: O0

void search_min(vector<int,_std::allocator<int>_> *array,
               vector<bool,_std::allocator<bool>_> *conditional,int *min_dist)

{
  bool bVar1;
  size_type sVar2;
  int *piVar3;
  reference this;
  thread *thread;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  reference_wrapper<std::vector<bool,_std::allocator<bool>_>_> local_80;
  reference_wrapper<std::vector<int,_std::allocator<int>_>_> local_78;
  thread local_70 [3];
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int w;
  int step;
  int b;
  int a;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  int num_workers;
  int *min_dist_local;
  vector<bool,_std::allocator<bool>_> *conditional_local;
  vector<int,_std::allocator<int>_> *array_local;
  
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 8;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&b);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(array);
  local_4c = (int)(sVar2 / (ulong)(long)threads.
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  for (local_50 = 0;
      local_50 <
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; local_50 = local_50 + 1) {
    step = local_50 * (local_4c + 1);
    local_54 = step + local_4c;
    sVar2 = std::vector<int,_std::allocator<int>_>::size(array);
    local_58 = (int)sVar2 + -1;
    piVar3 = std::min<int>(&local_54,&local_58);
    w = *piVar3;
    local_78 = std::ref<std::vector<int,std::allocator<int>>>(array);
    local_80 = std::ref<std::vector<bool,std::allocator<bool>>>(conditional);
    __range1 = (vector<std::thread,_std::allocator<std::thread>_> *)std::ref<int>(min_dist);
    std::thread::
    thread<void(&)(std::vector<int,std::allocator<int>>&,std::vector<bool,std::allocator<bool>>&,int,int,int&),std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<std::vector<bool,std::allocator<bool>>>,int&,int&,std::reference_wrapper<int>,void>
              (local_70,search_min_f_dijkstra,&local_78,&local_80,&step,&w,
               (reference_wrapper<int> *)&__range1);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back
              ((vector<std::thread,_std::allocator<std::thread>_> *)&b,local_70);
    std::thread::~thread(local_70);
  }
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)&b);
  thread = (thread *)
           std::vector<std::thread,_std::allocator<std::thread>_>::end
                     ((vector<std::thread,_std::allocator<std::thread>_> *)&b);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                     *)&thread), bVar1) {
    this = __gnu_cxx::
           __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
           ::operator*(&__end1);
    bVar1 = std::thread::joinable(this);
    if (bVar1) {
      std::thread::join();
    }
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&b);
  return;
}

Assistant:

void search_min(vector<int>& array, vector<bool>& conditional, int& min_dist){
    int num_workers = 8;
    vector<thread> threads;

    int a, b;
    int step = array.size() / num_workers;
    for (int w=0; w<num_workers; w++){
        a = w*(step+1);
        b = min(a+step, (int)array.size()-1);
        threads.push_back(thread(search_min_f_dijkstra, ref(array), ref(conditional), a, b, ref(min_dist)));
    }
    for (auto & thread : threads) {
        if (thread.joinable()) {
            thread.join();
        }
    }
}